

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O1

void __thiscall helics::FederateInfo::config_additional(FederateInfo *this,App *app)

{
  Option *pOVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--config","");
  pOVar1 = CLI::App::get_option(app,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pOVar1->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    config_additional();
  }
  return;
}

Assistant:

void FederateInfo::config_additional(CLI::App* app)
{
    auto* opt = app->get_option("--config");
    if (opt->count() > 0) {
        configString = opt->as<std::string>();
        if (CLI::ExistingFile(configString).empty()) {
            if (fileops::hasTomlExtension(configString)) {
                loadInfoFromToml(configString, false);
                fileInUse = true;

            } else if (fileops::hasJsonExtension(configString)) {
                loadInfoFromJson(configString, false);
                fileInUse = true;
            }
        }
    }
}